

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Cec_ManPrintFlopEquivs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint level;
  
  if (p->vNamesIn == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNamesIn != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x45d,"void Cec_ManPrintFlopEquivs(Gia_Man_t *)");
  }
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar8 = 0;
    do {
      iVar2 = p->vCis->nSize;
      uVar7 = (iVar2 - iVar5) + iVar8;
      if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCis->pArray[uVar7];
      lVar10 = (long)iVar5;
      if ((lVar10 < 0) || (p->nObjs <= iVar5)) {
LAB_005d190b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar6 = (ulong)(uint)p->pReprs[lVar10] & 0xfffffff;
      if (uVar6 != 0xfffffff) {
        pGVar1 = pGVar3 + lVar10;
        if ((uint)uVar6 == 0) {
          if (-1 < (int)*(undefined8 *)pGVar1) goto LAB_005d1968;
          uVar7 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
          if (p->vNamesIn->nSize <= (int)(uVar7 & 0x1fffffff)) goto LAB_005d1949;
          Abc_Print((int)pGVar1,"Original flop %s is proved equivalent to constant.\n",
                    *(undefined8 *)((long)p->vNamesIn->pArray + (ulong)(uVar7 << 3)));
        }
        else {
          if ((uint)p->nObjs <= (uint)uVar6) goto LAB_005d190b;
          pVVar4 = p->vNamesIn;
          iVar5 = (int)*(undefined8 *)pGVar1;
          uVar7 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
          if ((~(uint)*(undefined8 *)(pGVar3 + uVar6) & 0x9fffffff) == 0) {
            if (-1 < iVar5) {
LAB_005d1968:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            if (pVVar4->nSize <= (int)(uVar7 & 0x1fffffff)) {
LAB_005d1949:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar9 = (uint)((ulong)*(undefined8 *)(pGVar3 + uVar6) >> 0x20);
            level = uVar9 & 0x1fffffff;
            if ((uint)pVVar4->nSize <= level) goto LAB_005d1949;
            Abc_Print(level,"Original flop %s is proved equivalent to flop %s.\n",
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar7 << 3)),
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar9 << 3)));
          }
          else {
            if (-1 < iVar5) goto LAB_005d1968;
            if (pVVar4->nSize <= (int)(uVar7 & 0x1fffffff)) goto LAB_005d1949;
            Abc_Print((int)pGVar1,"Original flop %s is proved equivalent to internal node %d.\n",
                      *(undefined8 *)((long)pVVar4->pArray + (ulong)(uVar7 << 3)));
          }
        }
      }
      iVar8 = iVar8 + 1;
      iVar5 = p->nRegs;
    } while (iVar8 < iVar5);
  }
  return;
}

Assistant:

void Cec_ManPrintFlopEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pRepr;
    int i;
    assert( p->vNamesIn != NULL );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( Gia_ObjIsConst(p, Gia_ObjId(p, pObj)) )
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", Vec_PtrEntry(p->vNamesIn, Gia_ObjCioId(pObj)) );
        else if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
        {
            if ( Gia_ObjIsCi(pRepr) )
                Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj)  ),
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pRepr) ) );
            else
                Abc_Print( 1, "Original flop %s is proved equivalent to internal node %d.\n",
                    Vec_PtrEntry( p->vNamesIn, Gia_ObjCioId(pObj) ), Gia_ObjId(p, pRepr) );
        }
    }
}